

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<Qt::TimerId>::reallocateAndGrow
          (QArrayDataPointer<Qt::TimerId> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<Qt::TimerId> *old)

{
  long lVar1;
  bool bVar2;
  TimerId *pTVar3;
  QPodArrayOps<Qt::TimerId> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<Qt::TimerId> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<Qt::TimerId> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QArrayDataPointer<Qt::TimerId> *in_stack_ffffffffffffff70;
  QArrayDataPointer<Qt::TimerId> *in_stack_ffffffffffffff78;
  QArrayDataPointer<Qt::TimerId> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<Qt::TimerId> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pTVar3 = data((QArrayDataPointer<Qt::TimerId> *)&stack0xffffffffffffffe0),
       pTVar3 == (TimerId *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_0040b454;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<Qt::TimerId> *)
                  operator->((QArrayDataPointer<Qt::TimerId> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<Qt::TimerId> *)0x40b367);
        begin((QArrayDataPointer<Qt::TimerId> *)0x40b376);
        QtPrivate::QPodArrayOps<Qt::TimerId>::copyAppend
                  (this_00,(TimerId *)in_stack_ffffffffffffff78,(TimerId *)in_stack_ffffffffffffff70
                  );
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<Qt::TimerId> *)
             operator->((QArrayDataPointer<Qt::TimerId> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<Qt::TimerId> *)0x40b3af);
        begin((QArrayDataPointer<Qt::TimerId> *)0x40b3be);
        QtPrivate::QPodArrayOps<Qt::TimerId>::moveAppend
                  ((QPodArrayOps<Qt::TimerId> *)in_stack_ffffffffffffff70,
                   (TimerId *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (TimerId *)0x40b3dc);
      }
    }
    swap(in_stack_ffffffffffffff70,
         (QArrayDataPointer<Qt::TimerId> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,
           (QArrayDataPointer<Qt::TimerId> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QPodArrayOps<Qt::TimerId>::reallocate
              ((QPodArrayOps<Qt::TimerId> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0040b454:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }